

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O2

bool __thiscall QMainWindow::event(QMainWindow *this,QEvent *event)

{
  QPointer *this_00;
  short sVar1;
  long lVar2;
  QLayoutItem *pQVar3;
  bool bVar4;
  QStatusBar *this_01;
  QPoint QVar5;
  QMainWindowLayout *pQVar6;
  long in_FS_OFFSET;
  QPointF QVar7;
  QPointF local_58;
  QPoint local_48;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  this_00 = (QPointer *)(lVar2 + 600);
  bVar4 = QPointer::operator_cast_to_bool(this_00);
  if ((bVar4) &&
     (bVar4 = QMainWindowLayoutSeparatorHelper<QMainWindowLayout>::windowEvent
                        ((QMainWindowLayoutSeparatorHelper<QMainWindowLayout> *)
                         (*(long *)(lVar2 + 0x260) + 0x20),event), bVar4)) {
LAB_003fc19d:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return true;
    }
  }
  else {
    sVar1 = *(short *)(event + 8);
    switch(sVar1) {
    case 0x3c:
    case 0x3f:
      if (*(long *)(*(long *)(lVar2 + 0x260) + 0x808) != 0) {
LAB_003fc199:
        event[0xc] = (QEvent)0x1;
        goto LAB_003fc19d;
      }
      break;
    case 0x3d:
      if (*(long *)this_00 != 0) {
        pQVar3 = *(QLayoutItem **)(*(QMainWindowLayout **)(lVar2 + 0x260) + 0x808);
        if (pQVar3 != (QLayoutItem *)0x0) {
          pQVar6 = *(QMainWindowLayout **)(lVar2 + 0x260);
          if (*(int *)(*(long *)this_00 + 4) == 0) {
            pQVar6 = (QMainWindowLayout *)0x0;
          }
          local_58.xp = *(qreal *)(event + 0x10);
          local_58.yp = *(qreal *)(event + 0x18);
          QVar7 = QWidget::mapToGlobal(&this->super_QWidget,&local_58);
          local_40.ptr = (char16_t *)QVar7.yp;
          local_40.d = (Data *)QVar7.xp;
          local_48 = QPointF::toPoint((QPointF *)&local_40);
          QMainWindowLayout::hover(pQVar6,pQVar3,&local_48);
          goto LAB_003fc199;
        }
      }
      break;
    case 0x3e:
      if (*(long *)this_00 != 0) {
        pQVar3 = *(QLayoutItem **)(*(QMainWindowLayout **)(lVar2 + 0x260) + 0x808);
        if (pQVar3 != (QLayoutItem *)0x0) {
          pQVar6 = *(QMainWindowLayout **)(lVar2 + 0x260);
          if (*(int *)(*(long *)this_00 + 4) == 0) {
            pQVar6 = (QMainWindowLayout *)0x0;
          }
          QVar5 = QWidget::pos(&this->super_QWidget);
          local_40.d = (Data *)(((ulong)(QVar5.xp.m_i.m_i + 1) | (ulong)QVar5 & 0xffffffff00000000)
                               + 0x100000000);
          QMainWindowLayout::hover(pQVar6,pQVar3,(QPoint *)&local_40);
          goto LAB_003fc19d;
        }
      }
      break;
    default:
      if (sVar1 != 100) {
        if (sVar1 == 0x70) {
          this_01 = QMainWindowLayout::statusBar(*(QMainWindowLayout **)(lVar2 + 0x260));
          if (this_01 == (QStatusBar *)0x0) {
            event[0xc] = (QEvent)0x0;
          }
          else {
            local_40.d = *(Data **)(event + 0x10);
            local_40.ptr = *(char16_t **)(event + 0x18);
            local_40.size = *(qsizetype *)(event + 0x20);
            if (local_40.d != (Data *)0x0) {
              LOCK();
              ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            QStatusBar::showMessage(this_01,(QString *)&local_40,0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
          }
        }
        else {
          if (sVar1 != 0x78) break;
          QMainWindowLayout::toggleToolBarsVisible(*(QMainWindowLayout **)(lVar2 + 0x260));
        }
        goto LAB_003fc19d;
      }
      QDockAreaLayout::styleChangedEvent((QDockAreaLayout *)(*(long *)(lVar2 + 0x260) + 0x1a0));
      if (*(char *)(lVar2 + 0x270) == '\0') {
        local_40.d = (Data *)0xffffffffffffffff;
        setIconSize(this,(QSize *)&local_40);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      bVar4 = QWidget::event(&this->super_QWidget,event);
      return bVar4;
    }
  }
  __stack_chk_fail();
}

Assistant:

bool QMainWindow::event(QEvent *event)
{
    Q_D(QMainWindow);

#if QT_CONFIG(dockwidget)
    if (d->layout && d->layout->windowEvent(event))
        return true;
#endif

    switch (event->type()) {

#if QT_CONFIG(toolbar)
        case QEvent::ToolBarChange: {
            Q_ASSERT(d->layout);
            d->layout->toggleToolBarsVisible();
            return true;
        }
#endif

#if QT_CONFIG(statustip)
        case QEvent::StatusTip:
#if QT_CONFIG(statusbar)
            Q_ASSERT(d->layout);
            if (QStatusBar *sb = d->layout->statusBar())
                sb->showMessage(static_cast<QStatusTipEvent*>(event)->tip());
            else
#endif
                static_cast<QStatusTipEvent*>(event)->ignore();
            return true;
#endif // QT_CONFIG(statustip)

        case QEvent::StyleChange:
#if QT_CONFIG(dockwidget)
            Q_ASSERT(d->layout);
            d->layout->layoutState.dockAreaLayout.styleChangedEvent();
#endif
            if (!d->explicitIconSize)
                setIconSize(QSize());
            break;
#if QT_CONFIG(draganddrop)
        case QEvent::DragEnter:
        case QEvent::Drop:
            if (!d->layout->draggingWidget)
                break;
            event->accept();
            return true;
        case QEvent::DragMove: {
            if (!d->layout->draggingWidget)
                break;
            auto dragMoveEvent = static_cast<QDragMoveEvent *>(event);
            d->layout->hover(d->layout->draggingWidget,
                             mapToGlobal(dragMoveEvent->position()).toPoint());
            event->accept();
            return true;
        }
        case QEvent::DragLeave:
            if (!d->layout->draggingWidget)
                break;
            d->layout->hover(d->layout->draggingWidget, pos() - QPoint(-1, -1));
            return true;
#endif
        default:
            break;
    }

    return QWidget::event(event);
}